

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testdict.c
# Opt level: O2

StringPool * pool_new(size_t num_entries,size_t num_keys,xmlChar id)

{
  size_t __n;
  StringPool *pSVar1;
  xmlChar **__s;
  
  pSVar1 = (StringPool *)(*_xmlMalloc)(0x30);
  pSVar1->num_entries = num_entries;
  pSVar1->num_keys = num_keys;
  __n = num_keys * num_entries * 8;
  __s = (xmlChar **)(*_xmlMalloc)(__n);
  pSVar1->strings = __s;
  memset(__s,0,__n);
  pSVar1->num_strings = num_keys * num_entries;
  pSVar1->index = 0;
  pSVar1->id = id;
  return pSVar1;
}

Assistant:

static StringPool *
pool_new(size_t num_entries, size_t num_keys, xmlChar id) {
    StringPool *ret;
    size_t num_strings;

    ret = xmlMalloc(sizeof(*ret));
    ret->num_entries = num_entries;
    ret->num_keys = num_keys;
    num_strings = num_entries * num_keys;
    ret->strings = xmlMalloc(num_strings * sizeof(ret->strings[0]));
    memset(ret->strings, 0, num_strings * sizeof(ret->strings[0]));
    ret->num_strings = num_strings;
    ret->index = 0;
    ret->id = id;

    return ret;
}